

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.hpp
# Opt level: O2

void boost::xpressive::detail::
     common_compile<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
               (intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *regex,regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *impl,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  xpression_peeker<char> peeker;
  xpression_linker<char> linker;
  hash_peek_bitset<char> bset;
  intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iStack_f8;
  xpression_peeker<char> local_f0;
  xpression_linker<char> local_b0;
  hash_peek_bitset<char> local_48;
  
  xpression_linker<char>::
  xpression_linker<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            (&local_b0,tr);
  (*(regex->px->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable[3])(regex->px,&local_b0);
  local_48.icase_ = false;
  local_48.bset_.super__Base_bitset<4UL>._M_w[0] = 0;
  local_48.bset_.super__Base_bitset<4UL>._M_w[1] = 0;
  local_48.bset_.super__Base_bitset<4UL>._M_w[2] = 0;
  local_48.bset_.super__Base_bitset<4UL>._M_w[3] = 0;
  xpression_peeker<char>::
  xpression_peeker<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            (&local_f0,&local_48,tr,local_b0.has_backrefs_);
  (*(regex->px->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable[4])(regex->px,&local_f0);
  optimize_regex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            (&iStack_f8,&local_f0,tr);
  intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&impl->finder_,&iStack_f8);
  intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr(&iStack_f8);
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&impl->xpr_,regex);
  std::_Deque_base<const_void_*,_std::allocator<const_void_*>_>::~_Deque_base
            ((_Deque_base<const_void_*,_std::allocator<const_void_*>_> *)&local_b0);
  return;
}

Assistant:

void common_compile
(
    intrusive_ptr<matchable_ex<BidiIter> const> const &regex
  , regex_impl<BidiIter> &impl
  , Traits const &tr
)
{
    typedef typename iterator_value<BidiIter>::type char_type;

    // "link" the regex
    xpression_linker<char_type> linker(tr);
    regex->link(linker);

    // "peek" into the compiled regex to see if there are optimization opportunities
    hash_peek_bitset<char_type> bset;
    xpression_peeker<char_type> peeker(bset, tr, linker.has_backrefs());
    regex->peek(peeker);

    // optimization: get the peek chars OR the boyer-moore search string
    impl.finder_ = optimize_regex<BidiIter>(peeker, tr, is_random<BidiIter>());
    impl.xpr_ = regex;
}